

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_crl.cc
# Opt level: O0

int X509_CRL_add0_revoked(X509_CRL *crl,X509_REVOKED *rev)

{
  X509_CRL_INFO *pXVar1;
  stack_st_X509_REVOKED *psVar2;
  size_t sVar3;
  X509_CRL_INFO *inf;
  X509_REVOKED *rev_local;
  X509_CRL *crl_local;
  
  pXVar1 = crl->crl;
  if (pXVar1->revoked == (stack_st_X509_REVOKED *)0x0) {
    psVar2 = sk_X509_REVOKED_new(X509_REVOKED_cmp);
    pXVar1->revoked = (stack_st_X509_REVOKED *)psVar2;
  }
  if ((pXVar1->revoked != (stack_st_X509_REVOKED *)0x0) &&
     (sVar3 = sk_X509_REVOKED_push((stack_st_X509_REVOKED *)pXVar1->revoked,(X509_REVOKED *)rev),
     sVar3 != 0)) {
    asn1_encoding_clear((ASN1_ENCODING *)&pXVar1->enc);
    return 1;
  }
  return 0;
}

Assistant:

int X509_CRL_add0_revoked(X509_CRL *crl, X509_REVOKED *rev) {
  X509_CRL_INFO *inf;
  inf = crl->crl;
  if (!inf->revoked) {
    inf->revoked = sk_X509_REVOKED_new(X509_REVOKED_cmp);
  }
  if (!inf->revoked || !sk_X509_REVOKED_push(inf->revoked, rev)) {
    return 0;
  }
  asn1_encoding_clear(&inf->enc);
  return 1;
}